

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int phf_keycmp<phf_string>(phf_key<phf_string> *a,phf_key<phf_string> *b)

{
  uint uVar1;
  uint uVar2;
  size_t __n;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = -1;
  if (*a->n <= *b->n) {
    if (*a->n < *b->n) {
      iVar4 = 1;
    }
    else {
      uVar1 = b->g;
      uVar2 = a->g;
      if ((uVar1 > uVar2 || uVar2 == uVar1) && (iVar4 = 1, uVar1 <= uVar2)) {
        __n = (a->k).n;
        sVar3 = (b->k).n;
        bVar5 = true;
        if (__n == sVar3) {
          iVar4 = bcmp((a->k).p,(b->k).p,__n);
          bVar5 = iVar4 != 0;
        }
        iVar4 = 0;
        if ((a != b) && (!bVar5)) {
          if (__n == sVar3) {
            iVar4 = bcmp((a->k).p,(b->k).p,__n);
            if (iVar4 == 0) {
              __assert_fail("!(a->k == b->k)",
                            "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                            ,0x1e4,
                            "int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = phf_string]"
                           );
            }
          }
          abort();
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}